

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

PsbtGlobalRequestDataStruct * __thiscall
cfd::js::api::json::PsbtGlobalRequestData::ConvertToStruct
          (PsbtGlobalRequestDataStruct *__return_storage_ptr__,PsbtGlobalRequestData *this)

{
  _Rb_tree_header *p_Var1;
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  local_50;
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  local_38;
  
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  core::
  JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>
  ::ConvertToStruct(&local_50,&this->xpubs_);
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->xpubs).
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_50.
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->xpubs).
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_50.
       super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ::~vector(&local_38);
  std::
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ::~vector(&local_50);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  ConvertToStruct((vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
                   *)&local_50,&this->unknown_);
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->unknown).
                super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->unknown).
                super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->unknown).
                super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_50.
                super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_50.
                super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->unknown).
  super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_50.
                super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
  ~vector((vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           *)&local_38);
  std::vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>::
  ~vector((vector<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           *)&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtGlobalRequestDataStruct PsbtGlobalRequestData::ConvertToStruct() const {  // NOLINT
  PsbtGlobalRequestDataStruct result;
  result.xpubs = xpubs_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}